

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

void __thiscall ezexample::addns(ezexample *this,char c)

{
  vw *pvVar1;
  bool bVar2;
  uint64_t uVar3;
  substring sVar4;
  allocator local_39;
  char *local_38;
  long local_30;
  
  bVar2 = ensure_ns_exists(this,c);
  if (!bVar2) {
    features::clear((this->ec->super_example_predict).feature_space + c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->past_seeds,&this->current_seed);
    this->current_ns = c;
    this->str[0] = c;
    pvVar1 = this->vw_ref;
    std::__cxx11::string::string((string *)&local_38,this->str,&local_39);
    sVar4.end = local_38 + local_30;
    sVar4.begin = local_38;
    uVar3 = (*pvVar1->p->hasher)(sVar4,(ulong)pvVar1->hash_seed);
    this->current_seed = (fid)uVar3;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void addns(char c)
  {
    if (ensure_ns_exists(c))
      return;

    ec->feature_space[(int)c].clear();
    past_seeds.push_back(current_seed);
    current_ns = c;
    str[0] = c;
    current_seed = VW::hash_space(*vw_ref, str);
  }